

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O0

void __thiscall
nanojson3::json::
json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::write_element(json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,js_string *val)

{
  js_string_view val_00;
  bool bVar1;
  output_stream *poVar2;
  unsigned_long i;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view view;
  char local_38 [8];
  char buf [32];
  js_string *val_local;
  json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  buf._24_8_ = val;
  bVar1 = has_option(this,debug_dump_type_as_comment);
  if (bVar1) {
    bVar3 = sv("/***  STRING[",0xd);
    poVar2 = output_stream::operator<<(&this->output_,bVar3);
    i = std::__cxx11::string::size();
    view = integer_to_chars<32UL,_unsigned_long,_nullptr>((char (*) [32])local_38,i);
    poVar2 = output_stream::operator<<(poVar2,view);
    bVar3 = sv("]  ***/ ",8);
    output_stream::operator<<(poVar2,bVar3);
  }
  val_00 = (js_string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)buf._24_8_);
  write_string(this,val_00);
  return;
}

Assistant:

void write_element(const js_string& val)
        {
            using namespace std::string_view_literals;
            if (has_option(json_serialize_option::debug_dump_type_as_comment))
            {
                char buf[32];
                output_ << "/***  STRING["sv << integer_to_chars(buf, val.size()) << "]  ***/ "sv;
            }

            write_string(val);
        }